

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O3

bool QMetaType::
     registerConverter<QList<QPersistentModelIndex>,QIterable<QMetaSequence>,QtPrivate::QSequentialIterableConvertFunctor<QList<QPersistentModelIndex>>>
               (void)

{
  long lVar1;
  ConverterFunction converter;
  bool bVar2;
  long in_FS_OFFSET;
  code *pcVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar3 = std::
           _Function_handler<bool_(const_void_*,_void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qmetatype.h:636:26)>
           ::_M_manager;
  converter.super__Function_base._M_manager =
       std::
       _Function_handler<bool_(const_void_*,_void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qmetatype.h:636:26)>
       ::_M_manager;
  converter.super__Function_base._M_functor = (_Any_data)ZEXT816(0xaa);
  converter._M_invoker =
       std::
       _Function_handler<bool_(const_void_*,_void_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qmetatype.h:636:26)>
       ::_M_invoke;
  bVar2 = registerConverterImpl<QList<QPersistentModelIndex>,QIterable<QMetaSequence>>
                    (converter,(QMetaTypeInterface *)&stack0xffffffffffffffc8,(QMetaType)0x6b0080);
  if (pcVar3 != (code *)0x0) {
    (*pcVar3)(&stack0xffffffffffffffc8,&stack0xffffffffffffffc8,3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool registerConverter(UnaryFunction function)
    {
        static_assert((!QMetaTypeId2<To>::IsBuiltIn || !QMetaTypeId2<From>::IsBuiltIn),
            "QMetaType::registerConverter: At least one of the types must be a custom type.");

        const QMetaType fromType = QMetaType::fromType<From>();
        const QMetaType toType = QMetaType::fromType<To>();
        auto converter = [function = std::move(function)](const void *from, void *to) -> bool {
            const From *f = static_cast<const From *>(from);
            To *t = static_cast<To *>(to);
            auto &&r = function(*f);
            if constexpr (std::is_same_v<q20::remove_cvref_t<decltype(r)>, std::optional<To>>) {
                if (!r)
                    return false;
                *t = *std::forward<decltype(r)>(r);
            } else {
                *t = std::forward<decltype(r)>(r);
            }
            return true;
        };
        return registerConverterImpl<From, To>(std::move(converter), fromType, toType);
    }